

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall AI::HierarchicalTaskNetworkComponent::decide(HierarchicalTaskNetworkComponent *this)

{
  TaskDatabase *this_00;
  bool bVar1;
  bool bVar2;
  TaskIdentifier TVar3;
  World *this_01;
  GameMode *this_02;
  pointer pUVar4;
  char *pcVar5;
  pointer pTVar6;
  mapped_type *pmVar7;
  reference pvVar8;
  size_type sVar9;
  allocator<char> local_141;
  string local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0 [3];
  key_type local_80;
  byte local_79;
  TaskIdentifier goal;
  bool abortGoal;
  Utility *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  TaskDatabase *local_18;
  TaskDatabase *tasks;
  HierarchicalTaskNetworkComponent *this_local;
  
  tasks = (TaskDatabase *)this;
  this_01 = Component::getWorld(&this->super_Component);
  this_02 = World::getAuthGameMode(this_01);
  local_18 = GameMode::getAvailableTasks(this_02);
  if ((((this->planner).plan.finished & 1U) != 0) ||
     (bVar1 = std::vector<AI::Task,_std::allocator<AI::Task>_>::empty
                        ((vector<AI::Task,_std::allocator<AI::Task>_> *)&this->planner), bVar1)) {
    executeFinally(&(this->planner).plan,&this->state);
    TVar3 = evaluateNeeds(this);
    this->currentGoal = TVar3;
    Actor::getName_abi_cxx11_(&local_38,(this->super_Component).owner);
    pmVar7 = std::
             map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
             ::operator[](&local_18->tasks,&this->currentGoal);
    std::__cxx11::string::string((string *)&local_58,(string *)&pmVar7->debugName);
    log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
              ("[",&local_38,"] ","New goal: ",&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    updateTaskHistory(this);
    createPlan(this,this->currentGoal);
    std::
    map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
    ::operator[](&local_18->tasks,&this->currentGoal);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)&this->currentGoalName,pcVar5);
  }
  else if (((this->planner).plan.failed & 1U) == 0) {
    local_79 = 0;
    local_80 = Null;
    pTVar6 = __gnu_cxx::
             __normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
             operator->(&(this->planner).plan.currentTask);
    if ((pTVar6->action != PlayMontage) && (this->frameCount == 0x1e)) {
      isReaction(this->currentGoal);
    }
    bVar1 = std::vector<AI::Stimulus,_std::allocator<AI::Stimulus>_>::empty
                      (&(this->state).memory.sensoryMemory);
    if (!bVar1) {
      local_80 = evaluateNeeds(this);
      bVar1 = isReaction(local_80);
      if ((bVar1) &&
         (((bVar1 = isReaction(this->currentGoal), bVar1 && (this->currentGoal != local_80)) ||
          (bVar1 = isReaction(this->currentGoal), !bVar1)))) {
        Actor::getName_abi_cxx11_(local_e0,(this->super_Component).owner);
        pmVar7 = std::
                 map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
                 ::operator[](&local_18->tasks,&this->currentGoal);
        std::__cxx11::string::string((string *)&local_100,(string *)&pmVar7->debugName);
        pmVar7 = std::
                 map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
                 ::operator[](&local_18->tasks,&local_80);
        std::__cxx11::string::string((string *)&local_120,(string *)&pmVar7->debugName);
        log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string,char_const*,std::__cxx11::string>
                  ("[",local_e0,"] ","Aborted goal: ",&local_100," for reaction: ",&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)local_e0);
        local_79 = 1;
      }
    }
    if ((local_79 & 1) != 0) {
      executeFinally(&(this->planner).plan,&this->state);
      this->currentGoal = local_80;
      updateTaskHistory(this);
      createPlan(this,this->currentGoal);
      std::
      map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
      ::operator[](&local_18->tasks,&this->currentGoal);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::operator=((string *)&this->currentGoalName,pcVar5);
    }
  }
  else {
    fixFailedPlan(&(this->planner).plan,&this->state,&(this->planner).parameters,local_18);
    if (((this->planner).plan.failed & 1U) != 0) {
      local_70 = (Utility *)
                 __gnu_cxx::
                 __normal_iterator<AI::Utility_*,_std::vector<AI::Utility,_std::allocator<AI::Utility>_>_>
                 ::operator++(&this->utilityIterator,0);
      _goal = std::end<std::vector<AI::Utility,std::allocator<AI::Utility>>>(&this->utilities);
      bVar2 = __gnu_cxx::operator!=
                        (&this->utilityIterator,
                         (__normal_iterator<AI::Utility_*,_std::vector<AI::Utility,_std::allocator<AI::Utility>_>_>
                          *)&goal);
      bVar1 = false;
      if (bVar2) {
        pUVar4 = __gnu_cxx::
                 __normal_iterator<AI::Utility_*,_std::vector<AI::Utility,_std::allocator<AI::Utility>_>_>
                 ::operator->(&this->utilityIterator);
        bVar1 = 0.0 < pUVar4->score;
      }
      if (bVar1) {
        pUVar4 = __gnu_cxx::
                 __normal_iterator<AI::Utility_*,_std::vector<AI::Utility,_std::allocator<AI::Utility>_>_>
                 ::operator->(&this->utilityIterator);
        createPlan(this,pUVar4->task);
        this_00 = local_18;
        pUVar4 = __gnu_cxx::
                 __normal_iterator<AI::Utility_*,_std::vector<AI::Utility,_std::allocator<AI::Utility>_>_>
                 ::operator->(&this->utilityIterator);
        std::
        map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
        ::operator[](&this_00->tasks,&pUVar4->task);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::string::operator=((string *)&this->currentGoalName,pcVar5);
      }
      else {
        createPlan(this,Null);
        std::
        map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
        ::operator[](&local_18->tasks,&this->currentGoal);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::string::operator=((string *)&this->currentGoalName,pcVar5);
      }
    }
  }
  if ((((this->planner).plan.failed & 1U) == 0) &&
     ((((this->planner).plan.finished & 1U) == 0 || (this->currentGoal != Null)))) {
    __gnu_cxx::__normal_iterator<AI::Task_*,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>::
    operator->(&(this->planner).plan.currentTask);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_140,pcVar5,&local_141);
    std::__cxx11::string::operator=((string *)&this->currentTaskName,local_140);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  if (((((this->planner).plan.finished & 1U) != 0) && (this->currentGoal != Null)) &&
     ((pvVar8 = std::vector<AI::Task,_std::allocator<AI::Task>_>::operator[]
                          ((vector<AI::Task,_std::allocator<AI::Task>_> *)&this->planner,0),
      pvVar8->identifier != Null &&
      (sVar9 = std::vector<AI::Task,_std::allocator<AI::Task>_>::size
                         ((vector<AI::Task,_std::allocator<AI::Task>_> *)&this->planner), 1 < sVar9)
      ))) {
    decide(this);
  }
  this->frameCount = this->frameCount + 1;
  if (0x1e < this->frameCount) {
    this->frameCount = 0;
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::decide()
{
	auto& tasks = getWorld()->getAuthGameMode()->getAvailableTasks();

	if (planner.plan.finished || planner.plan.tasks.empty())
	{
		executeFinally(planner.plan, state);

		currentGoal = evaluateNeeds();

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
		log("[", owner->getName(), "] ", "New goal: ", tasks.tasks[currentGoal].debugName);
#endif

		updateTaskHistory();		

		createPlan(currentGoal);

		currentGoalName = tasks.tasks[currentGoal].debugName.c_str();
	}	
	else if (planner.plan.failed)
	{
		fixFailedPlan(planner.plan, state, planner.parameters, tasks);

		if (planner.plan.failed)
		{
			utilityIterator++;

			if (utilityIterator != end(utilities) && utilityIterator->score > 0.f)
			{
				createPlan(utilityIterator->task);
				currentGoalName = tasks.tasks[utilityIterator->task].debugName.c_str();
			}
			else
			{
				createPlan(TaskIdentifier::Null);
				currentGoalName = tasks.tasks[currentGoal].debugName.c_str();
			}				
		}
	}	
	else
	{
		bool abortGoal {false};
		TaskIdentifier goal {TaskIdentifier::Null};

		if (planner.plan.currentTask->action != Action::PlayMontage
			&& frameCount == 30
			&& !isReaction(currentGoal)
			&& false //TODO: consider removing the once-a-second task switch check with a emotions based check
			) //check once a second			
			//don't look for a better goal if we're currently playing a montage
		{
			//check if something higher priority can be done if we're just waiting
			goal = evaluateNeeds();

			if (goal != currentGoal)
			{
				abortGoal = true;

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
				log("[", owner->getName(), "] ", "New goal: ", tasks.tasks[goal].debugName);
#endif

			}
		}
		else if (!state.memory.sensoryMemory.empty())
		{
			goal = evaluateNeeds();

			if (isReaction(goal))
			{
				if ((isReaction(currentGoal) && currentGoal != goal)
					|| !isReaction(currentGoal))
				{
#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
					log("[", owner->getName(), "] ", "Aborted goal: ", tasks.tasks[currentGoal].debugName, " for reaction: ", tasks.tasks[goal].debugName);
#endif

					abortGoal = true;
				}
			}
		}

		if (abortGoal)
		{
			executeFinally(planner.plan, state);

			currentGoal = goal;
			
			updateTaskHistory();			

			createPlan(currentGoal);
			/*AIOwner->StopMovement();
			AIOwner->ClearFocus(EAIFocusPriority::Gameplay);
			*/

			currentGoalName = tasks.tasks[currentGoal].debugName.c_str();
		}
	}				
	
	if (!planner.plan.failed && (!planner.plan.finished || currentGoal != TaskIdentifier::Null))
	{
		currentTaskName = std::string(planner.plan.currentTask->debugName.c_str());
	}

	if (planner.plan.finished && currentGoal != TaskIdentifier::Null
		&& planner.plan.tasks[0].identifier != TaskIdentifier::Null
		&& planner.plan.tasks.size() > 1)
	{
		decide();
	}	

	frameCount++;

	if (frameCount > 30)
	{
		frameCount = 0;
	}
}